

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

QBitArray * __thiscall QVariant::toBitArray(QBitArray *__return_storage_ptr__,QVariant *this)

{
  PrivateShared *pPVar1;
  ulong uVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QBitArray>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc);
  bVar3 = ::comparesEqual(&local_28,&local_20);
  if (bVar3) {
    if (((this->d).field_0x18 & 1) != 0) {
      pPVar1 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar1->offset);
    }
    pPVar1 = (this->d).data.shared;
    (__return_storage_ptr__->d).d.d = (Data *)pPVar1;
    (__return_storage_ptr__->d).d.ptr = *(char **)((long)&(this->d).data + 8);
    (__return_storage_ptr__->d).d.size = *(qsizetype *)((long)&(this->d).data + 0x10);
    if (pPVar1 != (PrivateShared *)0x0) {
      LOCK();
      (pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type_conflict)
            (pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int> + 1);
      UNLOCK();
    }
  }
  else {
    (__return_storage_ptr__->d).d.d = (Data *)0x0;
    (__return_storage_ptr__->d).d.ptr = (char *)0x0;
    (__return_storage_ptr__->d).d.size = 0;
    uVar2 = *(ulong *)&(this->d).field_0x18;
    if ((uVar2 & 1) != 0) {
      pPVar1 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar1->offset);
    }
    QMetaType::convert((QMetaTypeInterface *)(uVar2 & 0xfffffffffffffffc),this,local_20,
                       __return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QBitArray QVariant::toBitArray() const
{
    return qvariant_cast<QBitArray>(*this);
}